

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O0

void depspawn::internal::common_wait_for(arg_info *pargs,int nargs)

{
  Workitem *ctx;
  Task *itask;
  undefined4 in_ESI;
  bool was_run;
  Workitem *w;
  int *in_stack_ffffffffffffffd0;
  arg_info **in_stack_ffffffffffffffd8;
  uint7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  byte bVar1;
  undefined4 in_stack_fffffffffffffff0;
  
  ctx = LinkedListPool<depspawn::internal::Workitem,true,false>::
        malloc<depspawn::internal::arg_info*&,int&>
                  ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                   CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  bVar1 = 0;
  itask = TaskPool::
          build_task<depspawn::internal::common_wait_for(depspawn::internal::arg_info*,int)::__0>
                    ((TaskPool *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ctx,
                     (anon_class_8_1_c6674b15_for__M_f *)(ulong)in_stack_ffffffffffffffe0);
  Workitem::insert_in_worklist(ctx,itask);
  while (((bVar1 ^ 0xff) & 1) != 0) {
    TaskPool::try_run((TaskPool *)CONCAT17(bVar1,in_stack_ffffffffffffffe0));
  }
  return;
}

Assistant:

void common_wait_for(arg_info *pargs, int nargs)
    {
      internal::Workitem* w = internal::Workitem::Pool.malloc(pargs, nargs);

#ifdef DEPSPAWN_USE_TBB
      tbb::task* const dummy = new (tbb::task::allocate_root()) tbb::empty_task;
      dummy->set_ref_count(1 + 1);

      w->insert_in_worklist(new (dummy->allocate_child()) internal::runner<decltype(FV)>(w, FV));

      dummy->wait_for_all();
      dummy->destroy(*dummy);
#else
      volatile bool was_run = false;

      w->insert_in_worklist(TP->build_task(w, [&was_run](){ was_run = true; }));
      
      while (!was_run) {
        TP->try_run();
      }
#endif

    }